

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderCsc::LossyDctDecoderCsc
          (LossyDctDecoderCsc *this,vector<char_*,_std::allocator<char_*>_> *rowPtrsR,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsG,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsB,char *packedAc,char *packedDc,
          unsigned_short *toLinear,int width,int height,PixelType typeR,PixelType typeG,
          PixelType typeB)

{
  LossyDctDecoderBase *in_RCX;
  undefined8 *in_RDI;
  char *in_R8;
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *in_R9;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  value_type *in_stack_ffffffffffffffc8;
  
  LossyDctDecoderBase::LossyDctDecoderBase
            (in_RCX,in_R8,(char *)in_R9,(unsigned_short *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__LossyDctDecoderCsc_0340e8c8;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
               *)in_R9,in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
               *)in_R9,in_stack_ffffffffffffffc8);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
               *)in_R9,in_stack_ffffffffffffffc8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_R9,(value_type *)in_stack_ffffffffffffffc8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_R9,(value_type *)in_stack_ffffffffffffffc8);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back
            (in_R9,(value_type *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

LossyDctDecoderCsc
        (std::vector<char *> &rowPtrsR,
         std::vector<char *> &rowPtrsG,
         std::vector<char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);
    }